

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::simpleExpression(Parse *this)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  size_type symInd;
  size_type sStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  Type local_44;
  undefined1 local_40 [4];
  Type helper_Type;
  string helper;
  int index;
  Parse *this_local;
  
  helper.field_2._12_4_ = this->curIndex;
  std::__cxx11::string::string((string *)local_40);
  iVar3 = additiveExpression(this);
  if (iVar3 == 0) {
    this->curIndex = helper.field_2._12_4_;
    this_local._4_4_ = 0;
  }
  else {
    std::__cxx11::string::operator=((string *)local_40,(string *)&this->relopTmp);
    local_44 = this->relopType;
    iVar3 = relop(this);
    if (iVar3 != 0) {
      iVar3 = additiveExpression(this);
      if (iVar3 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21b1c + 9);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      bVar2 = typePriority(this,this->relopType,local_44);
      if (!bVar2) {
        toSymTypeName_abi_cxx11_(&local_78,this,&local_44);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
        poVar4 = std::operator<<(poVar4,anon_var_dwarf_21aec);
        toSymTypeName_abi_cxx11_(&local_98,this,&this->relopType);
        poVar4 = std::operator<<(poVar4,(string *)&local_98);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        exit(0);
      }
      iVar3 = this->t_num + 1;
      this->t_num = iVar3;
      std::__cxx11::to_string(&local_d8,iVar3);
      std::operator+(&local_b8,"t",&local_d8);
      std::__cxx11::string::operator=((string *)&this->curTmpName,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,&this->relopName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &this->relopTmp,&this->curTmpName);
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      local_e8 = 0.0;
      uStack_e0._0_1_ = false;
      uStack_e0._1_1_ = false;
      uStack_e0._2_6_ = 0;
      local_f8._0_4_ = 0;
      local_f8._4_4_ = 0;
      uStack_f0._0_4_ = 0;
      uStack_f0._4_4_ = 0;
      local_108._0_4_ = 0;
      local_108._4_4_ = 0;
      uStack_100._0_4_ = 0;
      uStack_100._4_4_ = 0;
      local_118._M_allocated_capacity = 0;
      local_118._8_8_ = 0;
      symInd = 0;
      sStack_120 = 0;
      SymbolTableElement::SymbolTableElement((SymbolTableElement *)&symInd);
      std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::push_back
                (pvVar5,(SymbolTableElement *)&symInd);
      SymbolTableElement::~SymbolTableElement((SymbolTableElement *)&symInd);
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      sVar6 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::size(pvVar5);
      sVar6 = sVar6 - 1;
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar5,sVar6);
      std::__cxx11::string::operator=((string *)pvVar7,(string *)&this->curTmpName);
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar5,sVar6);
      pvVar7->type = BOOL;
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar5,sVar6);
      pvVar7->cat = CONST;
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar5,sVar6);
      pvVar7->isTemp = true;
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar5,sVar6);
      pvVar7->isActive = false;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->st->vallVec,(long)this->curFun);
      vVar1 = *pvVar8;
      pvVar5 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar7 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar5,sVar6);
      pvVar7->vall = vVar1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->st->vallVec,(long)this->curFun);
      *pvVar8 = *pvVar8 + 1;
      std::__cxx11::string::operator=((string *)&this->expName,(string *)&this->curTmpName);
    }
    std::__cxx11::string::operator=((string *)&this->simExpName,(string *)&this->relopTmp);
    this->simExpType = this->relopType;
    this_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int Parse::simpleExpression() {
    int index = curIndex;
    string helper;
    Type helper_Type;
    if(additiveExpression()) {
        helper = relopTmp;
        helper_Type = relopType;
        if(relop()) {
            if (additiveExpression()) {
                if(!typePriority(relopType, helper_Type)) {
//                    cout << helper_Type << " " << relopType << endl;
                    cout << toSymTypeName(helper_Type) <<"类型不匹配" << toSymTypeName(relopType)<< endl;
                    exit(0);
                }
                curTmpName = "t" + to_string(++t_num);
                quadVec.emplace_back(relopName, helper, relopTmp, curTmpName);
                st.symbolTable[curFun].push_back(SymbolTableElement());
                auto symInd = st.symbolTable[curFun].size() - 1;
                st.symbolTable[curFun][symInd].name = curTmpName;
                st.symbolTable[curFun][symInd].type = Type::BOOL;
                st.symbolTable[curFun][symInd].cat = Category ::CONST;
                st.symbolTable[curFun][symInd].isTemp = true;
                st.symbolTable[curFun][symInd].isActive = false;
                st.symbolTable[curFun][symInd].vall = st.vallVec[curFun];
                st.vallVec[curFun] += 1;
                expName = curTmpName;
            } else {
                cout << "表达式错误" << endl;
                exit(0);
            }
        }
        simExpName = relopTmp;
        simExpType = relopType;
        return 1;
    }
    curIndex = index;
    return 0;
}